

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O2

int __thiscall Vector::remove(Vector *this,char *__filename)

{
  long *plVar1;
  char *pcVar2;
  
  pcVar2 = (char *)this->vLength;
  if (__filename < pcVar2) {
    plVar1 = this->vData;
    while (__filename = __filename + 1, __filename < pcVar2) {
      plVar1[(long)(__filename + -1)] = plVar1[(long)__filename];
      pcVar2 = (char *)this->vLength;
    }
    pcVar2 = pcVar2 + -1;
    this->vLength = (unsigned_long)pcVar2;
  }
  return (int)pcVar2;
}

Assistant:

void Vector::remove(const unsigned long l) {
  if (l < vLength) {
    for (unsigned long k = l + 1; k < vLength; k++) {
      vData[k - 1] = vData[k];
    }
    vLength--;
  }
}